

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::substitute(HPresolve *this,HighsInt row,HighsInt col,double rhs)

{
  int iVar1;
  int row_00;
  int col_00;
  HighsLp *pHVar2;
  int *piVar3;
  uint *puVar4;
  HighsInt HVar5;
  pointer pdVar6;
  pointer piVar7;
  char *__name;
  int *piVar8;
  uint *puVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  HighsCDouble HVar14;
  HighsCDouble objscale;
  HighsCDouble local_40;
  
  HVar5 = findNonzero(this,row,col);
  dVar10 = -1.0 / (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[HVar5];
  markRowDeleted(this,row);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  iVar1 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  while (iVar1 != -1) {
    __name = (char *)(long)iVar1;
    row_00 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)__name];
    iVar1 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__name];
    if (row_00 != row) {
      dVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)__name] * dVar10;
      unlink(this,__name);
      pHVar2 = this->model;
      pdVar6 = (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar13 = pdVar6[row_00];
      dVar12 = dVar11 * rhs;
      if (-INFINITY < dVar13) {
        pdVar6[row_00] = dVar13 + dVar12;
      }
      pdVar6 = (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar13 = pdVar6[row_00];
      if (dVar13 < INFINITY) {
        pdVar6[row_00] = dVar12 + dVar13;
      }
      piVar3 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar8 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar3; piVar8 = piVar8 + 1) {
        col_00 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar8];
        if (col_00 != col) {
          addToMatrix(this,row_00,col_00,
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar8] * dVar11);
        }
      }
      reinsertEquation(this,row_00);
    }
  }
  dVar13 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    local_40.hi = dVar10 * dVar13;
    local_40.lo = 0.0;
    dVar10 = this->model->offset_;
    HVar14 = HighsCDouble::operator*(&local_40,rhs);
    dVar13 = HVar14.hi;
    dVar11 = dVar10 - dVar13;
    pHVar2 = this->model;
    pHVar2->offset_ =
         (((dVar10 - (dVar13 + dVar11)) + (-dVar13 - (dVar11 - (dVar13 + dVar11)))) - HVar14.lo) +
         dVar11;
    piVar8 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar8 == piVar3) {
      pdVar6 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      piVar7 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar8;
        dVar10 = pdVar6[piVar7[iVar1]];
        HVar14 = HighsCDouble::operator*
                           (&local_40,
                            (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar1]);
        dVar13 = HVar14.hi;
        dVar11 = dVar10 + dVar13;
        dVar11 = (dVar10 - (dVar11 - dVar13)) + (dVar13 - (dVar11 - (dVar11 - dVar13))) + HVar14.lo
                 + dVar11;
        piVar7 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar7[iVar1];
        pdVar6 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar6[iVar1] = dVar11;
        if (ABS(dVar11) <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
          pdVar6[iVar1] = 0.0;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar3);
    }
    pdVar6[col] = 0.0;
  }
  puVar4 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar9 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    unlink(this,(char *)(ulong)*puVar9);
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt row, HighsInt col, double rhs) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  HighsInt pos = findNonzero(row, col);
  assert(pos != -1);

  assert(Arow[pos] == row);
  assert(Acol[pos] == col);
  double substrowscale = -1.0 / Avalue[pos];
  assert(isImpliedFree(col));

  markRowDeleted(row);
  markColDeleted(col);

  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];

    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == col);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    // skip the row that is used for substitution
    if (row == colrow) continue;

    assert(findNonzero(colrow, col) != -1);

    // cancels out and bounds of dual row for this column do not need to be
    // updated
    unlink(colpos);

    // printf("\nbefore substitution: ");
    // debugPrintRow(colrow);

    // determine the scale for the substitution row for addition to this row
    double scale = colval * substrowscale;

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] += scale * rhs;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] += scale * rhs;

    for (HighsInt rowiter : rowpositions) {
      assert(Arow[rowiter] == row);

      if (Acol[rowiter] != col)
        addToMatrix(colrow, Acol[rowiter], scale * Avalue[rowiter]);
    }

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
    // printf("after substitution: ");
    // debugPrintRow(colrow);
  }

  assert(colsize[col] == 1);

  // substitute column in the objective function
  if (model->col_cost_[col] != 0.0) {
    HighsCDouble objscale = model->col_cost_[col] * substrowscale;
    model->offset_ = static_cast<double>(model->offset_ - objscale * rhs);
    assert(std::isfinite(model->offset_));
    for (HighsInt rowiter : rowpositions) {
      // printf("changing col cost to %g = %g + %g * %g\n",
      // double(model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]),
      // model->col_cost_[Acol[rowiter]], double(objscale), Avalue[rowiter]);
      model->col_cost_[Acol[rowiter]] = static_cast<double>(
          model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]);
      if (std::abs(model->col_cost_[Acol[rowiter]]) <=
          options->small_matrix_value)
        model->col_cost_[Acol[rowiter]] = 0.0;
    }
    assert(std::abs(model->col_cost_[col]) <=
           std::max(options->dual_feasibility_tolerance,
                    kHighsTiny * std::abs(static_cast<double>(objscale))));
    model->col_cost_[col] = 0.0;
  }

  // finally remove the entries of the row that was used for substitution
  for (HighsInt rowiter : rowpositions) unlink(rowiter);
}